

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

void apriltag_detector_clear_families(apriltag_detector_t *td)

{
  zarray_t *pzVar1;
  long lVar2;
  apriltag_family_t *fam;
  apriltag_family_t *local_20;
  
  pzVar1 = td->tag_families;
  if (pzVar1 != (zarray_t *)0x0) {
    lVar2 = 0;
    do {
      if (pzVar1->size <= lVar2) {
        pzVar1->size = 0;
        return;
      }
      memcpy(&local_20,pzVar1->data + pzVar1->el_sz * lVar2,pzVar1->el_sz);
      quick_decode_uninit(local_20);
      lVar2 = lVar2 + 1;
      pzVar1 = td->tag_families;
    } while (pzVar1 != (zarray_t *)0x0);
  }
  __assert_fail("za != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                ,0x84,"int zarray_size(const zarray_t *)");
}

Assistant:

void apriltag_detector_clear_families(apriltag_detector_t *td)
{
    for (int i = 0; i < zarray_size(td->tag_families); i++) {
        apriltag_family_t *fam;
        zarray_get(td->tag_families, i, &fam);
        quick_decode_uninit(fam);
    }
    zarray_clear(td->tag_families);
}